

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUpDownButton.cpp
# Opt level: O3

void __thiscall QUpDownButtonPrivate::~QUpDownButtonPrivate(QUpDownButtonPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x38);
  return;
}

Assistant:

class QUpDownButtonPrivate : public QObject {
    Q_OBJECT

public:
    explicit QUpDownButtonPrivate(QUpDownButton *widgetP, Qt::Orientation orientation)
        : QObject(widgetP)
        , widget(widgetP)
        , layout(new QBoxLayout(orientationToDirection(orientation), widget))
        , upButton(new QToolButton(widget))
        , downButton(new QToolButton(widget))
        , autoRaise(false) {
        Q_ASSERT(widget);

        layout->setContentsMargins(0, 0, 0, 0);
        layout->setSpacing(1);
        layout->addWidget(upButton);
        layout->addWidget(downButton);

        upButton->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
        downButton->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
        widget->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);

        updateButtonArrows();

        connect(upButton, &QAbstractButton::clicked, widget, &QUpDownButton::upClicked);
        connect(downButton, &QAbstractButton::clicked, widget, &QUpDownButton::downClicked);
        connect(upButton, &QAbstractButton::pressed, widget, &QUpDownButton::upPressed);
        connect(downButton, &QAbstractButton::pressed, widget, &QUpDownButton::downPressed);
        connect(upButton, &QAbstractButton::released, widget, &QUpDownButton::upReleased);
        connect(downButton, &QAbstractButton::released, widget, &QUpDownButton::downReleased);
        connect(upButton, &QAbstractButton::toggled, widget, &QUpDownButton::upToggled);
        connect(downButton, &QAbstractButton::toggled, widget, &QUpDownButton::downToggled);
        connect(upButton, &QToolButton::triggered, widget, &QUpDownButton::upTriggered);
        connect(downButton, &QToolButton::triggered, widget, &QUpDownButton::downTriggered);
    }

    Qt::Orientation directionToOrientation(QBoxLayout::Direction direction) const {
        switch (direction) {
        case QBoxLayout::LeftToRight:
        case QBoxLayout::RightToLeft:
            return Qt::Horizontal;
        case QBoxLayout::TopToBottom:
        case QBoxLayout::BottomToTop:
            return Qt::Vertical;
        }

        Q_UNREACHABLE();
    }